

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O2

long getDisp8N(PDISASM pMyDisasm)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  long lStack_8;
  
  switch((pMyDisasm->Reserved_).EVEX.tupletype) {
  case '\x01':
    if ((pMyDisasm->Reserved_).EVEX.b == '\0') goto switchD_001355ef_caseD_3;
  case '\x06':
    bVar3 = (pMyDisasm->Reserved_).EVEX.W;
LAB_00135618:
    iVar1 = 4;
LAB_00135672:
    return (long)(iVar1 << (bVar3 & 0x1f));
  case '\x02':
    if ((pMyDisasm->Reserved_).EVEX.b == '\0') goto switchD_001355ef_caseD_c;
  case '\a':
    lStack_8 = 4;
    break;
  case '\x03':
switchD_001355ef_caseD_3:
    bVar3 = (pMyDisasm->Reserved_).VEX.L;
    goto LAB_00135670;
  case '\x04':
    lStack_8 = 1;
    break;
  case '\x05':
    lStack_8 = 2;
    break;
  case '\b':
    lStack_8 = 8;
    break;
  case '\t':
    bVar3 = (pMyDisasm->Reserved_).EVEX.W;
    goto LAB_00135658;
  case '\n':
    bVar3 = (pMyDisasm->Reserved_).EVEX.W;
LAB_00135670:
    iVar1 = 0x10;
    goto LAB_00135672;
  case '\v':
    lStack_8 = 0x20;
    break;
  case '\f':
switchD_001355ef_caseD_c:
    bVar3 = (pMyDisasm->Reserved_).VEX.L;
LAB_00135658:
    iVar1 = 8;
    goto LAB_00135672;
  case '\r':
    bVar3 = (pMyDisasm->Reserved_).VEX.L;
    goto LAB_00135618;
  case '\x0e':
    bVar3 = (pMyDisasm->Reserved_).VEX.L;
    iVar1 = 2;
    goto LAB_00135672;
  case '\x0f':
    lStack_8 = 0x10;
    break;
  case '\x10':
    uVar2 = (ulong)(pMyDisasm->Reserved_).VEX.L;
    if (uVar2 < 3) {
      return *(long *)(&DAT_00138640 + uVar2 * 8);
    }
  default:
    lStack_8 = -1;
  }
  return lStack_8;
}

Assistant:

long __bea_callspec__ getDisp8N(PDISASM pMyDisasm)
{
  long N;
  switch (GV.EVEX.tupletype) {
    case FULL:
      if (GV.EVEX.b == 0) {
        N = 16 * (1 << GV.VEX.L);
      }
      else {
        N = 4 * (1 << GV.EVEX.W);
      }
      break;
    case HALF:
      if (GV.EVEX.b == 0) {
        N = 8 * (1 << GV.VEX.L);
      }
      else {
        N = 4;
      }
      break;
    case FULL_MEM:
      N = 16 * (1 << GV.VEX.L);
      break;
    case TUPLE1_SCALAR:
      N = 4 * (1 << GV.EVEX.W);
      break;
    case TUPLE1_SCALAR__8:
      N = 1;
      break;
    case TUPLE1_SCALAR__16:
      N = 2;
      break;
    case TUPLE1_FIXED__32:
      N = 4;
      break;
    case TUPLE1_FIXED__64:
      N = 8;
      break;
    case TUPLE2:
      N = 8 * (1 << GV.EVEX.W);
      break;
    case TUPLE4:
      N = 16 * (1 << GV.EVEX.W);
      break;
    case TUPLE8:
      N = 32;
      break;
    case HALF_MEM:
      N = 8 * (1 << GV.VEX.L);
      break;
    case QUARTER_MEM:
      N = 4 * (1 << GV.VEX.L);
      break;
    case EIGHTH_MEM:
      N = 2 * (1 << GV.VEX.L);
      break;
    case MEM128:
      N = 16;
      break;
    case MOVDDUP:
      if (GV.VEX.L == 0) {
        N = 8;
      }
      else if (GV.VEX.L == 1) {
        N = 32;
      }
      else if (GV.VEX.L == 2) {
        N = 64;
      }
      else {
        N = -1;
      }
      break;
    default:
      N = -1;
  }
  return N;
}